

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_screen_content_tools_info(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  aom_codec_err_t aVar4;
  long *plVar5;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar5 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar5 + 1;
  }
  puVar2 = (uint *)*plVar5;
  if (puVar2 == (uint *)0x0) {
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      lVar3 = *ctx->frame_worker->data1;
      *puVar2 = (uint)*(byte *)(lVar3 + 0x3d4f);
      puVar2[1] = (uint)*(byte *)(lVar3 + 0x3d50);
      puVar2[2] = (uint)*(byte *)(lVar3 + 0x3d4e);
      return AOM_CODEC_OK;
    }
    aVar4 = AOM_CODEC_ERROR;
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_get_screen_content_tools_info(
    aom_codec_alg_priv_t *ctx, va_list args) {
  aom_screen_content_tools_info *const sc_info =
      va_arg(args, aom_screen_content_tools_info *);
  if (sc_info) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1Decoder *pbi = frame_worker_data->pbi;
      sc_info->allow_screen_content_tools =
          pbi->common.features.allow_screen_content_tools;
      sc_info->allow_intrabc = pbi->common.features.allow_intrabc;
      sc_info->force_integer_mv =
          (int)pbi->common.features.cur_frame_force_integer_mv;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}